

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit_p.cpp
# Opt level: O3

void QCalendarPopup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == activated && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == newDateSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == hidingCalendar && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == resetButton && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    goto switchD_003eb216_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_003eb216_default;
  switch(_id) {
  case 0:
    local_20 = *_a[1];
    iVar3 = 0;
    break;
  case 1:
    local_20 = *_a[1];
    iVar3 = 1;
    break;
  case 2:
    local_20 = *_a[1];
    iVar3 = 2;
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QMetaObject::activate(_o,&staticMetaObject,3,(void **)0x0);
      return;
    }
    goto LAB_003eb3a0;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      dateSelected((QCalendarPopup *)_o,(QDate)*_a[1]);
      return;
    }
    goto LAB_003eb3a0;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      dateSelectionChanged((QCalendarPopup *)_o);
      return;
    }
    goto LAB_003eb3a0;
  default:
    goto switchD_003eb216_default;
  }
  local_10 = &local_20;
  local_18 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
switchD_003eb216_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_003eb3a0:
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCalendarPopup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 1: _t->newDateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 2: _t->hidingCalendar((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->resetButton(); break;
        case 4: _t->dateSelected((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->dateSelectionChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::newDateSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)(QDate )>(_a, &QCalendarPopup::hidingCalendar, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCalendarPopup::*)()>(_a, &QCalendarPopup::resetButton, 3))
            return;
    }
}